

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xmlXPathCastToBoolean(xmlXPathObjectPtr val)

{
  int iVar1;
  bool bVar2;
  
  if (val == (xmlXPathObjectPtr)0x0) {
    return 0;
  }
  iVar1 = 0;
  switch(val->type) {
  case XPATH_NODESET:
  case XPATH_XSLT_TREE:
    if (val->nodesetval == (xmlNodeSetPtr)0x0) {
      return 0;
    }
    bVar2 = val->nodesetval->nodeNr == 0;
    goto LAB_001bf3ea;
  case XPATH_BOOLEAN:
    iVar1 = val->boolval;
    break;
  case XPATH_NUMBER:
    bVar2 = val->floatval == 0.0;
LAB_001bf3ea:
    return (int)!bVar2;
  case XPATH_STRING:
    iVar1 = 0;
    if (val->stringval != (xmlChar *)0x0) {
      iVar1 = xmlStrlen(val->stringval);
      return (uint)(iVar1 != 0);
    }
  }
  return iVar1;
}

Assistant:

int
xmlXPathCastToBoolean (xmlXPathObjectPtr val) {
    int ret = 0;

    if (val == NULL)
	return(0);
    switch (val->type) {
    case XPATH_UNDEFINED:
	ret = 0;
	break;
    case XPATH_NODESET:
    case XPATH_XSLT_TREE:
	ret = xmlXPathCastNodeSetToBoolean(val->nodesetval);
	break;
    case XPATH_STRING:
	ret = xmlXPathCastStringToBoolean(val->stringval);
	break;
    case XPATH_NUMBER:
	ret = xmlXPathCastNumberToBoolean(val->floatval);
	break;
    case XPATH_BOOLEAN:
	ret = val->boolval;
	break;
    case XPATH_USERS:
	/* TODO */
	ret = 0;
	break;
    }
    return(ret);
}